

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substitute.c
# Opt level: O0

int find_text_end(pcre2_code_16 *code,PCRE2_SPTR16 *ptrptr,PCRE2_SPTR16 ptrend,BOOL last)

{
  PCRE2_UCHAR16 PVar1;
  uint32_t local_44;
  int local_40;
  uint32_t ch;
  int errorcode;
  int erc;
  PCRE2_SPTR16 ptr;
  BOOL literal;
  uint32_t nestlevel;
  int rc;
  BOOL last_local;
  PCRE2_SPTR16 ptrend_local;
  PCRE2_SPTR16 *ptrptr_local;
  pcre2_code_16 *code_local;
  
  literal = 0;
  ptr._4_4_ = 0;
  ptr._0_4_ = 0;
  _errorcode = *ptrptr;
  nestlevel = last;
  _rc = ptrend;
  ptrend_local = (PCRE2_SPTR16)ptrptr;
  ptrptr_local = (PCRE2_SPTR16 *)code;
  do {
    if (_rc <= _errorcode) {
      literal = -0x3a;
LAB_00193062:
      *(PCRE2_SPTR16 *)ptrend_local = _errorcode;
      return literal;
    }
    if ((int)ptr == 0) {
      if (*_errorcode == 0x7d) {
        if (ptr._4_4_ == 0) goto LAB_00193062;
        ptr._4_4_ = ptr._4_4_ + -1;
      }
      else {
        if (((*_errorcode == 0x3a) && (nestlevel == 0)) && (ptr._4_4_ == 0)) goto LAB_00193062;
        if (*_errorcode == 0x24) {
          if ((_errorcode < _rc + -1) && (_errorcode[1] == 0x7b)) {
            ptr._4_4_ = ptr._4_4_ + 1;
            _errorcode = _errorcode + 1;
          }
        }
        else if (*_errorcode == 0x5c) {
          if ((_errorcode < _rc + -1) &&
             (((PVar1 = _errorcode[1], PVar1 == 0x4c || (PVar1 == 0x55)) ||
              ((PVar1 == 0x6c || (PVar1 == 0x75)))))) {
            _errorcode = _errorcode + 1;
          }
          else {
            _errorcode = _errorcode + 1;
            ch = _pcre2_check_escape_16
                           ((PCRE2_SPTR16 *)&errorcode,_rc,&local_44,&local_40,
                            *(uint32_t *)(ptrptr_local + 0xb),0,(compile_block_16 *)0x0);
            _errorcode = _errorcode + -1;
            if (local_40 != 0) {
              literal = local_40;
              goto LAB_00193062;
            }
            if ((ch != 0) && (ch != 0x19)) {
              if (ch != 0x1a) {
                literal = -0x39;
                goto LAB_00193062;
              }
              ptr._0_4_ = 1;
            }
          }
        }
      }
    }
    else if (((*_errorcode == 0x5c) && (_errorcode < _rc + -1)) && (_errorcode[1] == 0x45)) {
      ptr._0_4_ = 0;
      _errorcode = _errorcode + 1;
    }
    _errorcode = _errorcode + 1;
  } while( true );
}

Assistant:

static int
find_text_end(const pcre2_code *code, PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend,
  BOOL last)
{
int rc = 0;
uint32_t nestlevel = 0;
BOOL literal = FALSE;
PCRE2_SPTR ptr = *ptrptr;

for (; ptr < ptrend; ptr++)
  {
  if (literal)
    {
    if (ptr[0] == CHAR_BACKSLASH && ptr < ptrend - 1 && ptr[1] == CHAR_E)
      {
      literal = FALSE;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_RIGHT_CURLY_BRACKET)
    {
    if (nestlevel == 0) goto EXIT;
    nestlevel--;
    }

  else if (*ptr == CHAR_COLON && !last && nestlevel == 0) goto EXIT;

  else if (*ptr == CHAR_DOLLAR_SIGN)
    {
    if (ptr < ptrend - 1 && ptr[1] == CHAR_LEFT_CURLY_BRACKET)
      {
      nestlevel++;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_BACKSLASH)
    {
    int erc;
    int errorcode;
    uint32_t ch;

    if (ptr < ptrend - 1) switch (ptr[1])
      {
      case CHAR_L:
      case CHAR_l:
      case CHAR_U:
      case CHAR_u:
      ptr += 1;
      continue;
      }

    ptr += 1;  /* Must point after \ */
    erc = PRIV(check_escape)(&ptr, ptrend, &ch, &errorcode,
      code->overall_options, FALSE, NULL);
    ptr -= 1;  /* Back to last code unit of escape */
    if (errorcode != 0)
      {
      rc = errorcode;
      goto EXIT;
      }

    switch(erc)
      {
      case 0:      /* Data character */
      case ESC_E:  /* Isolated \E is ignored */
      break;

      case ESC_Q:
      literal = TRUE;
      break;

      default:
      rc = PCRE2_ERROR_BADREPESCAPE;
      goto EXIT;
      }
    }
  }

rc = PCRE2_ERROR_REPMISSINGBRACE;   /* Terminator not found */

EXIT:
*ptrptr = ptr;
return rc;
}